

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayoutPrivate::QGridLayoutPrivate(QGridLayoutPrivate *this)

{
  QGridLayoutPrivate *in_RDI;
  
  QLayoutPrivate::QLayoutPrivate(&in_RDI->super_QLayoutPrivate);
  *(undefined ***)&in_RDI->super_QLayoutPrivate = &PTR__QGridLayoutPrivate_00d074d0;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x330f6b);
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x330f7c);
  QList<int>::QList((QList<int> *)0x330f8d);
  QList<int>::QList((QList<int> *)0x330f9e);
  QList<int>::QList((QList<int> *)0x330faf);
  QList<int>::QList((QList<int> *)0x330fc0);
  QList<QGridBox_*>::QList((QList<QGridBox_*> *)0x330fd1);
  in_RDI->field_0x194 = in_RDI->field_0x194 & 0xef;
  setDirty(in_RDI);
  in_RDI->cc = 0;
  in_RDI->rr = 0;
  in_RDI->nextC = 0;
  in_RDI->nextR = 0;
  in_RDI->hfwData = (QList<QLayoutStruct> *)0x0;
  in_RDI->field_0x194 = in_RDI->field_0x194 & 0xfe;
  in_RDI->field_0x194 = in_RDI->field_0x194 & 0xfd;
  in_RDI->horizontalSpacing = -1;
  in_RDI->verticalSpacing = -1;
  return;
}

Assistant:

QGridLayoutPrivate::QGridLayoutPrivate()
{
    addVertical = false;
    setDirty();
    rr = cc = 0;
    nextR = nextC = 0;
    hfwData = nullptr;
    hReversed = false;
    vReversed = false;
    horizontalSpacing = -1;
    verticalSpacing = -1;
}